

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

char * upb_DecodeStatus_String(upb_DecodeStatus status)

{
  char *pcStack_10;
  upb_DecodeStatus status_local;
  
  switch(status) {
  case kUpb_DecodeStatus_Ok:
    pcStack_10 = "Ok";
    break;
  case kUpb_DecodeStatus_Malformed:
    pcStack_10 = "Wire format was corrupt";
    break;
  case kUpb_DecodeStatus_OutOfMemory:
    pcStack_10 = "Arena alloc failed";
    break;
  case kUpb_DecodeStatus_BadUtf8:
    pcStack_10 = "String field had bad UTF-8";
    break;
  case kUpb_DecodeStatus_MaxDepthExceeded:
    pcStack_10 = "Exceeded upb_DecodeOptions_MaxDepth";
    break;
  case kUpb_DecodeStatus_MissingRequired:
    pcStack_10 = "Missing required field";
    break;
  case kUpb_DecodeStatus_UnlinkedSubMessage:
    pcStack_10 = "Unlinked sub-message field was present";
    break;
  default:
    pcStack_10 = "Unknown decode status";
  }
  return pcStack_10;
}

Assistant:

const char* upb_DecodeStatus_String(upb_DecodeStatus status) {
  switch (status) {
    case kUpb_DecodeStatus_Ok:
      return "Ok";
    case kUpb_DecodeStatus_Malformed:
      return "Wire format was corrupt";
    case kUpb_DecodeStatus_OutOfMemory:
      return "Arena alloc failed";
    case kUpb_DecodeStatus_BadUtf8:
      return "String field had bad UTF-8";
    case kUpb_DecodeStatus_MaxDepthExceeded:
      return "Exceeded upb_DecodeOptions_MaxDepth";
    case kUpb_DecodeStatus_MissingRequired:
      return "Missing required field";
    case kUpb_DecodeStatus_UnlinkedSubMessage:
      return "Unlinked sub-message field was present";
    default:
      return "Unknown decode status";
  }
}